

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibraryCase.cpp
# Opt level: O1

string * __thiscall
deqp::sl::ShaderCase::specializeVertexShader_abi_cxx11_
          (string *__return_storage_ptr__,ShaderCase *this,char *src,ValueBlock *valueBlock)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  int iVar4;
  bool bVar5;
  string *__return_storage_ptr___00;
  DataType DVar6;
  char *__s;
  char *__s_00;
  size_t sVar7;
  long lVar8;
  pointer pVVar9;
  byte bVar10;
  char *pcVar11;
  ostream *poVar12;
  long lVar13;
  long lVar14;
  bool bVar15;
  StringTemplate tmpl;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  ostringstream decl;
  ostringstream setup;
  ostringstream output;
  undefined1 auStack_568 [7];
  allocator<char> local_561;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  char *local_540;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_538;
  long local_4f8;
  long local_4f0;
  char *local_4e8;
  ValueBlock *local_4e0;
  char *local_4d8;
  string *local_4d0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_4c8;
  undefined1 local_498 [376];
  undefined1 local_320 [376];
  undefined1 local_1a8 [376];
  
  local_4e0 = valueBlock;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  bVar15 = GLSL_VERSION_150 < this->m_targetVersion;
  bVar10 = 0xe >> ((byte)this->m_targetVersion & 0x1f);
  local_540 = "attribute";
  bVar5 = (bVar10 & 1) != 0;
  if (bVar5 || bVar15) {
    local_540 = "in";
  }
  local_4e8 = "varying";
  if (bVar5 || bVar15) {
    local_4e8 = "out";
  }
  local_4d8 = src;
  local_4d0 = __return_storage_ptr__;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"gl_Position = dEQP_Position;\n",0x1d);
  lVar8 = 9;
  if ((bVar10 & 1) != 0 || bVar15) {
    lVar8 = 2;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,local_540,lVar8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_498," highp vec4 dEQP_Position;\n",0x1b);
  pVVar9 = (local_4e0->values).
           super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(local_4e0->values).
                              super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar9) >> 3) *
          0x38e38e39) {
    local_4f0 = 9;
    if ((bVar10 & 1) != 0 || bVar15) {
      local_4f0 = 2;
    }
    local_4f8 = (ulong)((byte)~(bVar10 | bVar15) & 1) * 4 + 3;
    lVar8 = 0x28;
    lVar14 = 0;
    do {
      pcVar11 = *(char **)((long)pVVar9 + lVar8 + -0x20);
      DVar6 = glu::getDataTypeFloatScalars(*(DataType *)((long)&pVVar9->storageType + lVar8));
      __s = glu::getDataTypeName(DVar6);
      __s_00 = glu::getDataTypeName(*(DataType *)((long)&pVVar9->storageType + lVar8));
      iVar4 = *(int *)((long)pVVar9 + lVar8 + -0x28);
      if (iVar4 == 2) {
        DVar6 = glu::getDataTypeScalarType(*(DataType *)((long)&pVVar9->storageType + lVar8));
        if (DVar6 == TYPE_FLOAT) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_498,local_4e8,local_4f8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498," ",1);
          if (__s == (char *)0x0) {
            std::ios::clear((int)auStack_568 + (int)*(_func_int **)(local_498._0_8_ + -0x18) + 0xd0)
            ;
          }
          else {
            sVar7 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,__s,sVar7);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498," ",1);
LAB_00dac143:
          if (pcVar11 == (char *)0x0) {
            lVar13 = 2;
            std::ios::clear((int)auStack_568 + (int)*(_func_int **)(local_498._0_8_ + -0x18) + 0xd0)
            ;
            poVar12 = (ostream *)local_498;
            pcVar11 = ";\n";
          }
          else {
            sVar7 = strlen(pcVar11);
            lVar13 = 2;
            poVar12 = (ostream *)local_498;
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar11,sVar7);
            pcVar11 = ";\n";
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_498,local_4e8,local_4f8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498," ",1);
          if (__s == (char *)0x0) {
            std::ios::clear((int)auStack_568 + (int)*(_func_int **)(local_498._0_8_ + -0x18) + 0xd0)
            ;
          }
          else {
            sVar7 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,__s,sVar7);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498," v_",3);
          if (pcVar11 == (char *)0x0) {
            std::ios::clear((int)auStack_568 + (int)*(_func_int **)(local_498._0_8_ + -0x18) + 0xd0)
            ;
          }
          else {
            sVar7 = strlen(pcVar11);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,pcVar11,sVar7);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,";\n",2);
          if (__s_00 == (char *)0x0) {
            std::ios::clear((int)auStack_568 + (int)*(_func_int **)(local_498._0_8_ + -0x18) + 0xd0)
            ;
          }
          else {
            sVar7 = strlen(__s_00);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,__s_00,sVar7);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498," ",1);
          if (pcVar11 == (char *)0x0) {
            std::ios::clear((int)auStack_568 + (int)*(_func_int **)(local_498._0_8_ + -0x18) + 0xd0)
            ;
          }
          else {
            sVar7 = strlen(pcVar11);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,pcVar11,sVar7);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,";\n",2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"v_",2);
          if (pcVar11 == (char *)0x0) {
            std::ios::clear((int)auStack_568 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x3c0
                           );
          }
          else {
            sVar7 = strlen(pcVar11);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar11,sVar7);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," = ",3);
          if (__s == (char *)0x0) {
            std::ios::clear((int)auStack_568 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x3c0
                           );
          }
          else {
            sVar7 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar7);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"(",1);
          if (pcVar11 == (char *)0x0) {
            lVar13 = 3;
            std::ios::clear((int)auStack_568 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x3c0
                           );
            poVar12 = (ostream *)local_1a8;
            pcVar11 = ");\n";
          }
          else {
            sVar7 = strlen(pcVar11);
            lVar13 = 3;
            poVar12 = (ostream *)local_1a8;
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar11,sVar7);
            pcVar11 = ");\n";
          }
        }
LAB_00dac643:
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar11,lVar13);
      }
      else if (iVar4 == 1) {
        DVar6 = glu::getDataTypeScalarType(*(DataType *)((long)&pVVar9->storageType + lVar8));
        if (DVar6 == TYPE_FLOAT) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_498,local_540,local_4f0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498," ",1);
          if (__s == (char *)0x0) {
            std::ios::clear((int)auStack_568 + (int)*(_func_int **)(local_498._0_8_ + -0x18) + 0xd0)
            ;
          }
          else {
            sVar7 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,__s,sVar7);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498," ",1);
          goto LAB_00dac143;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,local_540,local_4f0)
        ;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498," ",1);
        if (__s == (char *)0x0) {
          std::ios::clear((int)auStack_568 + (int)*(_func_int **)(local_498._0_8_ + -0x18) + 0xd0);
        }
        else {
          sVar7 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,__s,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498," a_",3);
        if (pcVar11 == (char *)0x0) {
          std::ios::clear((int)auStack_568 + (int)*(_func_int **)(local_498._0_8_ + -0x18) + 0xd0);
        }
        else {
          sVar7 = strlen(pcVar11);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,pcVar11,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,";\n",2);
        if (__s_00 == (char *)0x0) {
          std::ios::clear((int)auStack_568 + (int)*(_func_int **)(local_320._0_8_ + -0x18) + 0x248);
        }
        else {
          sVar7 = strlen(__s_00);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,__s_00,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
        if (pcVar11 == (char *)0x0) {
          std::ios::clear((int)auStack_568 + (int)*(_func_int **)(local_320._0_8_ + -0x18) + 0x248);
        }
        else {
          sVar7 = strlen(pcVar11);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar11,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," = ",3);
        if (__s_00 == (char *)0x0) {
          std::ios::clear((int)auStack_568 + (int)*(_func_int **)(local_320._0_8_ + -0x18) + 0x248);
        }
        else {
          sVar7 = strlen(__s_00);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,__s_00,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"(a_",3);
        if (pcVar11 == (char *)0x0) {
          lVar13 = 3;
          std::ios::clear((int)auStack_568 + (int)*(_func_int **)(local_320._0_8_ + -0x18) + 0x248);
          poVar12 = (ostream *)local_320;
          pcVar11 = ");\n";
        }
        else {
          sVar7 = strlen(pcVar11);
          lVar13 = 3;
          poVar12 = (ostream *)local_320;
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar11,sVar7);
          pcVar11 = ");\n";
        }
        goto LAB_00dac643;
      }
      lVar14 = lVar14 + 1;
      pVVar9 = (local_4e0->values).
               super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x48;
    } while (lVar14 < (int)((ulong)((long)(local_4e0->values).
                                          super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar9)
                           >> 3) * 0x38e38e39);
  }
  local_4c8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_4c8._M_impl.super__Rb_tree_header._M_header;
  local_4c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_4c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_4c8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_4c8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_4c8._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::stringbuf::str();
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_538,(char (*) [13])0x1ceeb9c,&local_560);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&local_4c8,&local_538);
  paVar1 = &local_538.second.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538.second._M_dataplus._M_p != paVar1) {
    operator_delete(local_538.second._M_dataplus._M_p,
                    local_538.second.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_538.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_538.first._M_dataplus._M_p,
                    local_538.first.field_2._M_allocated_capacity + 1);
  }
  paVar3 = &local_560.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560._M_dataplus._M_p != paVar3) {
    operator_delete(local_560._M_dataplus._M_p,local_560.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_538,(char (*) [6])0x1af3bc3,&local_560);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&local_4c8,&local_538);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538.second._M_dataplus._M_p != paVar1) {
    operator_delete(local_538.second._M_dataplus._M_p,
                    local_538.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_538.first._M_dataplus._M_p,
                    local_538.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560._M_dataplus._M_p != paVar3) {
    operator_delete(local_560._M_dataplus._M_p,local_560.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[7],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_538,(char (*) [7])0x1cf66db,&local_560);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&local_4c8,&local_538);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538.second._M_dataplus._M_p != paVar1) {
    operator_delete(local_538.second._M_dataplus._M_p,
                    local_538.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_538.first._M_dataplus._M_p,
                    local_538.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560._M_dataplus._M_p != paVar3) {
    operator_delete(local_560._M_dataplus._M_p,local_560.field_2._M_allocated_capacity + 1);
  }
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[20],_const_char_(&)[12],_true>
            (&local_538,(char (*) [20])"POSITION_FRAG_COLOR",(char (*) [12])0x1a32b36);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&local_4c8,&local_538);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538.second._M_dataplus._M_p != paVar1) {
    operator_delete(local_538.second._M_dataplus._M_p,
                    local_538.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_538.first._M_dataplus._M_p,
                    local_538.first.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_560,local_4d8,&local_561);
  __return_storage_ptr___00 = local_4d0;
  tcu::StringTemplate::StringTemplate((StringTemplate *)&local_538,&local_560);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560._M_dataplus._M_p != paVar3) {
    operator_delete(local_560._M_dataplus._M_p,local_560.field_2._M_allocated_capacity + 1);
  }
  tcu::StringTemplate::specialize
            (__return_storage_ptr___00,(StringTemplate *)&local_538,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_4c8);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&local_538);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_4c8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base((ios_base *)(local_320 + 0x70));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
  std::ios_base::~ios_base((ios_base *)(local_498 + 0x70));
  return __return_storage_ptr___00;
}

Assistant:

string ShaderCase::specializeVertexShader(const char* src, const ValueBlock& valueBlock)
{
	ostringstream decl;
	ostringstream setup;
	ostringstream output;
	const bool	usesInout = usesShaderInoutQualifiers(m_targetVersion);
	const char*   vtxIn		= usesInout ? "in" : "attribute";
	const char*   vtxOut	= usesInout ? "out" : "varying";

	// Output (write out position).
	output << "gl_Position = dEQP_Position;\n";

	// Declarations (position + attribute for each input, varying for each output).
	decl << vtxIn << " highp vec4 dEQP_Position;\n";
	for (int ndx = 0; ndx < (int)valueBlock.values.size(); ndx++)
	{
		const ShaderCase::Value& val		  = valueBlock.values[ndx];
		const char*				 valueName	= val.valueName.c_str();
		DataType				 floatType	= getDataTypeFloatScalars(val.dataType);
		const char*				 floatTypeStr = getDataTypeName(floatType);
		const char*				 refTypeStr   = getDataTypeName(val.dataType);

		if (val.storageType == ShaderCase::Value::STORAGE_INPUT)
		{
			if (getDataTypeScalarType(val.dataType) == TYPE_FLOAT)
			{
				decl << vtxIn << " " << floatTypeStr << " " << valueName << ";\n";
			}
			else
			{
				decl << vtxIn << " " << floatTypeStr << " a_" << valueName << ";\n";
				setup << refTypeStr << " " << valueName << " = " << refTypeStr << "(a_" << valueName << ");\n";
			}
		}
		else if (val.storageType == ShaderCase::Value::STORAGE_OUTPUT)
		{
			if (getDataTypeScalarType(val.dataType) == TYPE_FLOAT)
				decl << vtxOut << " " << floatTypeStr << " " << valueName << ";\n";
			else
			{
				decl << vtxOut << " " << floatTypeStr << " v_" << valueName << ";\n";
				decl << refTypeStr << " " << valueName << ";\n";

				output << "v_" << valueName << " = " << floatTypeStr << "(" << valueName << ");\n";
			}
		}
	}

	// Shader specialization.
	map<string, string> params;
	params.insert(pair<string, string>("DECLARATIONS", decl.str()));
	params.insert(pair<string, string>("SETUP", setup.str()));
	params.insert(pair<string, string>("OUTPUT", output.str()));
	params.insert(pair<string, string>("POSITION_FRAG_COLOR", "gl_Position"));

	StringTemplate tmpl(src);
	return tmpl.specialize(params);
}